

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_stream_upstream.c
# Opt level: O0

char * ngx_stream_upstream_server(ngx_conf_t *cf,ngx_command_t *cmd,void *conf)

{
  void *pvVar1;
  int iVar2;
  ngx_int_t *__s;
  ngx_str_t *pnVar3;
  ngx_int_t nVar4;
  ngx_stream_upstream_server_t *us;
  ngx_uint_t i;
  ngx_int_t max_fails;
  ngx_int_t max_conns;
  ngx_int_t weight;
  ngx_url_t u;
  ngx_str_t s;
  ngx_str_t *value;
  time_t fail_timeout;
  ngx_stream_upstream_srv_conf_t *uscf;
  void *conf_local;
  ngx_command_t *cmd_local;
  ngx_conf_t *cf_local;
  
  __s = (ngx_int_t *)ngx_array_push(*(ngx_array_t **)((long)conf + 0x20));
  if (__s == (ngx_int_t *)0x0) {
    cf_local = (ngx_conf_t *)0xffffffffffffffff;
  }
  else {
    memset(__s,0,0x50);
    pvVar1 = cf->args->elts;
    max_conns = 1;
    max_fails = 0;
    i = 1;
    value = (ngx_str_t *)0xa;
    for (us = (ngx_stream_upstream_server_t *)0x2;
        us < (ngx_stream_upstream_server_t *)cf->args->nelts;
        us = (ngx_stream_upstream_server_t *)((long)&(us->name).len + 1)) {
      iVar2 = strncmp(*(char **)((long)pvVar1 + (long)us * 0x10 + 8),"weight=",7);
      if (iVar2 == 0) {
        if ((*(ulong *)((long)conf + 0x28) & 2) == 0) {
LAB_001f9413:
          ngx_conf_log_error(1,cf,0,"balancing method does not support parameter \"%V\"",
                             (void *)((long)pvVar1 + (long)us * 0x10));
          return (char *)0xffffffffffffffff;
        }
        max_conns = ngx_atoi((u_char *)(*(long *)((long)pvVar1 + (long)us * 0x10 + 8) + 7),
                             *(long *)((long)pvVar1 + (long)us * 0x10) - 7);
        if ((max_conns == -1) || (max_conns == 0)) goto LAB_001f93db;
      }
      else {
        iVar2 = strncmp(*(char **)((long)pvVar1 + (long)us * 0x10 + 8),"max_conns=",10);
        if (iVar2 == 0) {
          if ((*(ulong *)((long)conf + 0x28) & 0x100) == 0) goto LAB_001f9413;
          max_fails = ngx_atoi((u_char *)(*(long *)((long)pvVar1 + (long)us * 0x10 + 8) + 10),
                               *(long *)((long)pvVar1 + (long)us * 0x10) - 10);
          pnVar3 = (ngx_str_t *)max_fails;
        }
        else {
          iVar2 = strncmp(*(char **)((long)pvVar1 + (long)us * 0x10 + 8),"max_fails=",10);
          if (iVar2 == 0) {
            if ((*(ulong *)((long)conf + 0x28) & 4) == 0) goto LAB_001f9413;
            i = ngx_atoi((u_char *)(*(long *)((long)pvVar1 + (long)us * 0x10 + 8) + 10),
                         *(long *)((long)pvVar1 + (long)us * 0x10) - 10);
            pnVar3 = (ngx_str_t *)i;
          }
          else {
            iVar2 = strncmp(*(char **)((long)pvVar1 + (long)us * 0x10 + 8),"fail_timeout=",0xd);
            if (iVar2 != 0) {
              iVar2 = strcmp(*(char **)((long)pvVar1 + (long)us * 0x10 + 8),"backup");
              if (iVar2 == 0) {
                if ((*(ulong *)((long)conf + 0x28) & 0x20) == 0) goto LAB_001f9413;
                *(byte *)(__s + 9) = *(byte *)(__s + 9) & 0xfd | 2;
              }
              else {
                iVar2 = strcmp(*(char **)((long)pvVar1 + (long)us * 0x10 + 8),"down");
                if (iVar2 != 0) goto LAB_001f93db;
                if ((*(ulong *)((long)conf + 0x28) & 0x10) == 0) goto LAB_001f9413;
                *(byte *)(__s + 9) = *(byte *)(__s + 9) & 0xfe | 1;
              }
              goto LAB_001f9276;
            }
            if ((*(ulong *)((long)conf + 0x28) & 8) == 0) goto LAB_001f9413;
            u.err = (char *)(*(long *)((long)pvVar1 + (long)us * 0x10) + -0xd);
            value = (ngx_str_t *)ngx_parse_time((ngx_str_t *)&u.err,1);
            pnVar3 = value;
          }
        }
        if (pnVar3 == (ngx_str_t *)0xffffffffffffffff) {
LAB_001f93db:
          ngx_conf_log_error(1,cf,0,"invalid parameter \"%V\"",
                             (void *)((long)pvVar1 + (long)us * 0x10));
          return (char *)0xffffffffffffffff;
        }
      }
LAB_001f9276:
    }
    memset(&weight,0,0xd8);
    weight = *(ngx_int_t *)((long)pvVar1 + 0x10);
    u.url.len = *(size_t *)((long)pvVar1 + 0x18);
    nVar4 = ngx_parse_url(cf->pool,(ngx_url_t *)&weight);
    if (nVar4 == 0) {
      if (((byte)u.port >> 3 & 1) == 0) {
        *__s = weight;
        __s[1] = u.url.len;
        __s[2] = u.sockaddr._104_8_;
        __s[3] = (ngx_int_t)u.addrs;
        __s[4] = max_conns;
        __s[5] = max_fails;
        __s[6] = i;
        __s[7] = (ngx_int_t)value;
        cf_local = (ngx_conf_t *)0x0;
      }
      else {
        ngx_conf_log_error(1,cf,0,"no port in upstream \"%V\"",&weight);
        cf_local = (ngx_conf_t *)0xffffffffffffffff;
      }
    }
    else {
      if (u.naddrs != 0) {
        ngx_conf_log_error(1,cf,0,"%s in upstream \"%V\"",u.naddrs,&weight);
      }
      cf_local = (ngx_conf_t *)0xffffffffffffffff;
    }
  }
  return (char *)cf_local;
}

Assistant:

static char *
ngx_stream_upstream_server(ngx_conf_t *cf, ngx_command_t *cmd, void *conf)
{
    ngx_stream_upstream_srv_conf_t  *uscf = conf;

    time_t                         fail_timeout;
    ngx_str_t                     *value, s;
    ngx_url_t                      u;
    ngx_int_t                      weight, max_conns, max_fails;
    ngx_uint_t                     i;
    ngx_stream_upstream_server_t  *us;

    us = ngx_array_push(uscf->servers);
    if (us == NULL) {
        return NGX_CONF_ERROR;
    }

    ngx_memzero(us, sizeof(ngx_stream_upstream_server_t));

    value = cf->args->elts;

    weight = 1;
    max_conns = 0;
    max_fails = 1;
    fail_timeout = 10;

    for (i = 2; i < cf->args->nelts; i++) {

        if (ngx_strncmp(value[i].data, "weight=", 7) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_WEIGHT)) {
                goto not_supported;
            }

            weight = ngx_atoi(&value[i].data[7], value[i].len - 7);

            if (weight == NGX_ERROR || weight == 0) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "max_conns=", 10) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_MAX_CONNS)) {
                goto not_supported;
            }

            max_conns = ngx_atoi(&value[i].data[10], value[i].len - 10);

            if (max_conns == NGX_ERROR) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "max_fails=", 10) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_MAX_FAILS)) {
                goto not_supported;
            }

            max_fails = ngx_atoi(&value[i].data[10], value[i].len - 10);

            if (max_fails == NGX_ERROR) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strncmp(value[i].data, "fail_timeout=", 13) == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_FAIL_TIMEOUT)) {
                goto not_supported;
            }

            s.len = value[i].len - 13;
            s.data = &value[i].data[13];

            fail_timeout = ngx_parse_time(&s, 1);

            if (fail_timeout == (time_t) NGX_ERROR) {
                goto invalid;
            }

            continue;
        }

        if (ngx_strcmp(value[i].data, "backup") == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_BACKUP)) {
                goto not_supported;
            }

            us->backup = 1;

            continue;
        }

        if (ngx_strcmp(value[i].data, "down") == 0) {

            if (!(uscf->flags & NGX_STREAM_UPSTREAM_DOWN)) {
                goto not_supported;
            }

            us->down = 1;

            continue;
        }

        goto invalid;
    }

    ngx_memzero(&u, sizeof(ngx_url_t));

    u.url = value[1];

    if (ngx_parse_url(cf->pool, &u) != NGX_OK) {
        if (u.err) {
            ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                               "%s in upstream \"%V\"", u.err, &u.url);
        }

        return NGX_CONF_ERROR;
    }

    if (u.no_port) {
        ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                           "no port in upstream \"%V\"", &u.url);
        return NGX_CONF_ERROR;
    }

    us->name = u.url;
    us->addrs = u.addrs;
    us->naddrs = u.naddrs;
    us->weight = weight;
    us->max_conns = max_conns;
    us->max_fails = max_fails;
    us->fail_timeout = fail_timeout;

    return NGX_CONF_OK;

invalid:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "invalid parameter \"%V\"", &value[i]);

    return NGX_CONF_ERROR;

not_supported:

    ngx_conf_log_error(NGX_LOG_EMERG, cf, 0,
                       "balancing method does not support parameter \"%V\"",
                       &value[i]);

    return NGX_CONF_ERROR;
}